

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# afloader.c
# Opt level: O2

FT_Int32 af_loader_compute_darkening(AF_Loader loader,FT_Face face,FT_Pos standard_width)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  AF_Module pAVar6;
  int iVar7;
  int iVar8;
  FT_Long FVar9;
  ulong uVar10;
  FT_Long FVar11;
  FT_Long FVar12;
  int iVar13;
  long lVar14;
  uint uVar15;
  ulong uVar16;
  uint uVar17;
  ulong b_;
  
  pAVar6 = loader->globals->module;
  iVar13._0_2_ = (face->size->metrics).x_ppem;
  iVar13._2_2_ = (face->size->metrics).y_ppem;
  b_ = 0x40000;
  if (3 < (ushort)(undefined2)iVar13) {
    b_ = (ulong)(uint)(iVar13 << 0x10);
  }
  iVar1._0_2_ = face->units_per_EM;
  iVar1._2_2_ = face->ascender;
  FVar9 = FT_DivFix(0x3e80000,(ulong)(uint)(iVar1 << 0x10));
  if (FVar9 < 0x28f) {
    return 0;
  }
  if (standard_width < 1) {
    lVar14 = 0x4b0000;
  }
  else {
    lVar14 = (long)(int)FVar9 * (long)((int)standard_width << 0x10);
    lVar14 = (long)(int)((ulong)((lVar14 >> 0x3f) + lVar14 + 0x8000) >> 0x10);
  }
  iVar13 = pAVar6->darken_params[0];
  iVar1 = pAVar6->darken_params[6];
  iVar7 = 0x1f;
  uVar15 = (uint)lVar14;
  if (uVar15 != 0) {
    for (; uVar15 >> iVar7 == 0; iVar7 = iVar7 + -1) {
    }
  }
  iVar8 = 0x1f;
  uVar17 = (uint)b_;
  if (uVar17 != 0) {
    for (; uVar17 >> iVar8 == 0; iVar8 = iVar8 + -1) {
    }
  }
  if ((uint)(iVar8 + iVar7) < 0x2e) {
    uVar10 = (ulong)(int)((ulong)((int)uVar17 * lVar14 + ((int)uVar17 * lVar14 >> 0x3f) + 0x8000) >>
                         0x10);
  }
  else {
    uVar10 = (ulong)(uint)(iVar1 << 0x10);
  }
  iVar7 = pAVar6->darken_params[1];
  uVar16 = (ulong)(uint)(iVar13 << 0x10);
  if ((long)uVar16 <= (long)uVar10) {
    iVar8 = pAVar6->darken_params[2];
    iVar2 = pAVar6->darken_params[3];
    iVar3 = pAVar6->darken_params[4];
    iVar4 = pAVar6->darken_params[5];
    iVar5 = pAVar6->darken_params[7];
    if (uVar10 < (uint)(iVar8 << 0x10)) {
      FVar11 = FT_DivFix(uVar16,b_);
      iVar13 = iVar8 - iVar13;
      if (iVar13 != 0) {
        FVar11 = FT_MulDiv((long)(int)(uVar15 - (int)FVar11),(long)(iVar2 - iVar7),(long)iVar13);
        FVar12 = FT_DivFix((ulong)(uint)(iVar7 << 0x10),b_);
        FVar12 = FVar12 + FVar11;
        goto LAB_00238539;
      }
LAB_00238483:
      FVar11 = FT_DivFix((ulong)(uint)(iVar8 << 0x10),b_);
      if (iVar3 - iVar8 != 0) {
        FVar11 = FT_MulDiv((long)(int)(uVar15 - (int)FVar11),(long)(iVar4 - iVar2),
                           (long)(iVar3 - iVar8));
        FVar12 = FT_DivFix((ulong)(uint)(iVar2 << 0x10),b_);
        FVar12 = FVar12 + FVar11;
        goto LAB_00238539;
      }
      uVar16 = (ulong)(uint)(iVar3 << 0x10);
    }
    else {
      uVar16 = (ulong)(uint)(iVar3 << 0x10);
      if (uVar10 < uVar16) goto LAB_00238483;
      iVar7 = iVar5;
      if ((uint)(iVar1 << 0x10) <= uVar10) goto LAB_002384c5;
    }
    FVar11 = FT_DivFix(uVar16,b_);
    iVar7 = iVar5;
    if (iVar1 - iVar3 != 0) {
      FVar11 = FT_MulDiv((long)(int)(uVar15 - (int)FVar11),(long)(iVar5 - iVar4),
                         (long)(iVar1 - iVar3));
      FVar12 = FT_DivFix((ulong)(uint)(iVar4 << 0x10),b_);
      FVar12 = FVar12 + FVar11;
      goto LAB_00238539;
    }
  }
LAB_002384c5:
  FVar12 = FT_DivFix((ulong)(uint)(iVar7 << 0x10),b_);
LAB_00238539:
  FVar9 = FT_DivFix(FVar12,FVar9);
  return (int)FVar9 + 0x8000 >> 0x10;
}

Assistant:

FT_LOCAL_DEF( FT_Int32 )
  af_loader_compute_darkening( AF_Loader  loader,
                               FT_Face    face,
                               FT_Pos     standard_width )
  {
    AF_Module  module = loader->globals->module;

    FT_UShort  units_per_EM;
    FT_Fixed   ppem, em_ratio;
    FT_Fixed   stem_width, stem_width_per_1000, scaled_stem, darken_amount;
    FT_Int     log_base_2;
    FT_Int     x1, y1, x2, y2, x3, y3, x4, y4;


    ppem         = FT_MAX( af_intToFixed( 4 ),
                           af_intToFixed( face->size->metrics.x_ppem ) );
    units_per_EM = face->units_per_EM;

    em_ratio = FT_DivFix( af_intToFixed( 1000 ),
                          af_intToFixed ( units_per_EM ) );
    if ( em_ratio < af_floatToFixed( .01 ) )
    {
      /* If something goes wrong, don't embolden. */
      return 0;
    }

    x1 = module->darken_params[0];
    y1 = module->darken_params[1];
    x2 = module->darken_params[2];
    y2 = module->darken_params[3];
    x3 = module->darken_params[4];
    y3 = module->darken_params[5];
    x4 = module->darken_params[6];
    y4 = module->darken_params[7];

    if ( standard_width <= 0 )
    {
      stem_width          = af_intToFixed( 75 ); /* taken from cf2font.c */
      stem_width_per_1000 = stem_width;
    }
    else
    {
      stem_width          = af_intToFixed( standard_width );
      stem_width_per_1000 = FT_MulFix( stem_width, em_ratio );
    }

    log_base_2 = FT_MSB( (FT_UInt32)stem_width_per_1000 ) +
                 FT_MSB( (FT_UInt32)ppem );

    if ( log_base_2 >= 46 )
    {
      /* possible overflow */
      scaled_stem = af_intToFixed( x4 );
    }
    else
      scaled_stem = FT_MulFix( stem_width_per_1000, ppem );

    /* now apply the darkening parameters */
    if ( scaled_stem < af_intToFixed( x1 ) )
      darken_amount = FT_DivFix( af_intToFixed( y1 ), ppem );

    else if ( scaled_stem < af_intToFixed( x2 ) )
    {
      FT_Int  xdelta = x2 - x1;
      FT_Int  ydelta = y2 - y1;
      FT_Int  x      = stem_width_per_1000 -
                       FT_DivFix( af_intToFixed( x1 ), ppem );


      if ( !xdelta )
        goto Try_x3;

      darken_amount = FT_MulDiv( x, ydelta, xdelta ) +
                      FT_DivFix( af_intToFixed( y1 ), ppem );
    }

    else if ( scaled_stem < af_intToFixed( x3 ) )
    {
    Try_x3:
      {
        FT_Int  xdelta = x3 - x2;
        FT_Int  ydelta = y3 - y2;
        FT_Int  x      = stem_width_per_1000 -
                         FT_DivFix( af_intToFixed( x2 ), ppem );


        if ( !xdelta )
          goto Try_x4;

        darken_amount = FT_MulDiv( x, ydelta, xdelta ) +
                        FT_DivFix( af_intToFixed( y2 ), ppem );
      }
    }

    else if ( scaled_stem < af_intToFixed( x4 ) )
    {
    Try_x4:
      {
        FT_Int  xdelta = x4 - x3;
        FT_Int  ydelta = y4 - y3;
        FT_Int  x      = stem_width_per_1000 -
                         FT_DivFix( af_intToFixed( x3 ), ppem );


        if ( !xdelta )
          goto Use_y4;

        darken_amount = FT_MulDiv( x, ydelta, xdelta ) +
                        FT_DivFix( af_intToFixed( y3 ), ppem );
      }
    }

    else
    {
    Use_y4:
      darken_amount = FT_DivFix( af_intToFixed( y4 ), ppem );
    }

    /* Convert darken_amount from per 1000 em to true character space. */
    return af_fixedToInt( FT_DivFix( darken_amount, em_ratio ) );
  }